

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_Char FT_Stream_ReadChar(FT_Stream stream,FT_Error *error)

{
  unsigned_long uVar1;
  uchar local_21;
  FT_Error *pFStack_20;
  FT_Byte result;
  FT_Error *error_local;
  FT_Stream stream_local;
  
  local_21 = '\0';
  *error = 0;
  pFStack_20 = error;
  error_local = (FT_Error *)stream;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (stream->pos < stream->size) {
      local_21 = stream->base[stream->pos];
      goto LAB_0014b0a1;
    }
  }
  else {
    uVar1 = (*stream->read)(stream,stream->pos,&local_21,1);
    if (uVar1 == 1) {
LAB_0014b0a1:
      *(long *)(error_local + 4) = *(long *)(error_local + 4) + 1;
      return local_21;
    }
  }
  *pFStack_20 = 0x55;
  return '\0';
}

Assistant:

FT_BASE_DEF( FT_Char )
  FT_Stream_ReadChar( FT_Stream  stream,
                      FT_Error*  error )
  {
    FT_Byte  result = 0;


    FT_ASSERT( stream );

    *error = FT_Err_Ok;

    if ( stream->read )
    {
      if ( stream->read( stream, stream->pos, &result, 1L ) != 1L )
        goto Fail;
    }
    else
    {
      if ( stream->pos < stream->size )
        result = stream->base[stream->pos];
      else
        goto Fail;
    }
    stream->pos++;

    return (FT_Char)result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadChar:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return 0;
  }